

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O2

void mpark::detail::
     constructor<mpark::detail::traits<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>
     ::
     generic_construct<mpark::detail::copy_constructor<mpark::detail::traits<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,(mpark::detail::Trait)1>const&>
               (constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *lhs,copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                     *rhs)

{
  ulong uVar1;
  undefined1 local_11;
  
  destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::destroy(&lhs->
             super_destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
           );
  uVar1 = (ulong)(rhs->
                 super_move_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                 ).
                 super_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super_destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                 .
                 super_base<(mpark::detail::Trait)1,_int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .index_;
  if (uVar1 != 0xffffffff) {
    (**(code **)(visitation::
                 fdiagonal<mpark::detail::constructor<mpark::detail::traits<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>::generic_construct<mpark::detail::copy_constructor<mpark::detail::traits<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,(mpark::detail::Trait)1>const&>(mpark::detail::constructor<mpark::detail::traits<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>&,mpark::detail::copy_constructor<mpark::detail::traits<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,(mpark::detail::Trait)1>const&)::{lambda(auto:1&,auto:2&&)#1}&&,mpark::detail::base<(mpark::detail::Trait)1,int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>&,mpark::detail::base<(mpark::detail::Trait)1,int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>const&>
                 ::value + uVar1 * 8))(&local_11,lhs,rhs);
    (lhs->
    super_destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
    ).
    super_base<(mpark::detail::Trait)1,_int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .index_ = (rhs->
              super_move_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
              ).
              super_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super_destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
              .
              super_base<(mpark::detail::Trait)1,_int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .index_;
  }
  return;
}

Assistant:

inline static void generic_construct(constructor &lhs, Rhs &&rhs) {
        lhs.destroy();
        if (!rhs.valueless_by_exception()) {
          visitation::alt::visit_alt_at(
              rhs.index(),
#ifdef MPARK_GENERIC_LAMBDAS
              [](auto &lhs_alt, auto &&rhs_alt) {
                constructor::construct_alt(
                    lhs_alt, lib::forward<decltype(rhs_alt)>(rhs_alt).value);
              }
#else
              ctor{}
#endif
              ,
              lhs,
              lib::forward<Rhs>(rhs));
          lhs.index_ = rhs.index_;
        }
      }